

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

bool wasm_memory_grow(wasm_memory_t *memory,wasm_memory_pages_t delta)

{
  Memory *this;
  Result RVar1;
  
  this = (Memory *)(memory->super_wasm_extern_t).super_wasm_ref_t.I.obj_;
  if ((this->super_Extern).super_Object.kind_ == Memory) {
    RVar1 = wabt::interp::Memory::Grow(this,delta);
    return RVar1.enum_ == Ok;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Memory, Base = wabt::interp::Object]"
               );
}

Assistant:

bool wasm_memory_grow(wasm_memory_t* memory, wasm_memory_pages_t delta) {
  return Succeeded(memory->As<Memory>()->Grow(delta));
}